

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_Browse(void)

{
  Vector3 debugSphereColour;
  Task *in_RDI;
  int in_R8D;
  undefined1 local_ae0 [8];
  Task wait;
  undefined1 local_748 [8];
  Task moveToDestination;
  undefined1 local_3c8 [8];
  Task selectStack;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  Task *browse;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"browse",&local_39);
  Task::Task(in_RDI,&local_38,Compound);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  Task::Task((Task *)local_3c8);
  selectStack.modifiedVectors._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  moveToDestination.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage._4_4_ = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             &selectStack.parameters.vectors.
              super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (value_type_conflict1 *)
             ((long)&moveToDestination.parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                     _M_impl.super__Bvector_impl_data._M_end_of_storage + 4));
  wait.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x3ecccccd3f4ccccd;
  debugSphereColour.z = 0.4;
  debugSphereColour.x = 0.8;
  debugSphereColour.y = 0.4;
  create_MoveToDestination((Task *)local_748,(AI *)0x1,70.0,debugSphereColour,1.0,true,true,in_R8D);
  create_Wait((Task *)local_ae0,5.0);
  Task::addSubtask(in_RDI,(Task *)local_3c8);
  Task::addSubtask(in_RDI,(Task *)local_748);
  Task::addSubtask(in_RDI,(Task *)local_ae0);
  local_11 = 1;
  Task::~Task((Task *)local_ae0);
  Task::~Task((Task *)local_748);
  Task::~Task((Task *)local_3c8);
  if ((local_11 & 1) == 0) {
    Task::~Task(in_RDI);
  }
  return in_RDI;
}

Assistant:

Task create_Browse()
	{
		Task browse  {"browse", TaskType::Compound};
		Task selectStack;
		selectStack.action = Action::SelectDestination;
		selectStack.parameters.values.push_back(static_cast<float>(DestinationType::RandomStack));

		auto moveToDestination = create_MoveToDestination(70.f, {0.8f, 0.4f, 0.4f});
		auto wait = create_Wait(5.f);

		browse.addSubtask(selectStack);
		browse.addSubtask(moveToDestination);
		browse.addSubtask(wait);

		return browse;
	}